

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beagle.cpp
# Opt level: O0

int beagleRemoveScaleFactorsByPartition
              (int instance,int *scalingIndices,int count,int cumulativeScalingIndex,
              int partitionIndex)

{
  BeagleImpl *pBVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined4 in_R8D;
  int returnValue;
  BeagleImpl *beagleInstance;
  int in_stack_ffffffffffffffcc;
  undefined4 local_4;
  
  pBVar1 = beagle::getBeagleInstance(in_stack_ffffffffffffffcc);
  if (pBVar1 == (BeagleImpl *)0x0) {
    local_4 = -4;
  }
  else {
    local_4 = (**(code **)(*(long *)pBVar1 + 0x118))(pBVar1,in_RSI,in_EDX,in_ECX,in_R8D);
  }
  return local_4;
}

Assistant:

int beagleRemoveScaleFactorsByPartition(int instance,
                                        const int* scalingIndices,
                                        int count,
                                        int cumulativeScalingIndex,
                                        int partitionIndex) {
    DEBUG_START_TIME();
//    try {
        beagle::BeagleImpl* beagleInstance = beagle::getBeagleInstance(instance);
        if (beagleInstance == NULL)
            return BEAGLE_ERROR_UNINITIALIZED_INSTANCE;
        int returnValue = beagleInstance->removeScaleFactorsByPartition(scalingIndices, count, cumulativeScalingIndex, partitionIndex);
        DEBUG_END_TIME();
        return returnValue;
//    }
//    catch (std::bad_alloc &) {
//        return BEAGLE_ERROR_OUT_OF_MEMORY;
//    }
//    catch (std::out_of_range &) {
//        return BEAGLE_ERROR_OUT_OF_RANGE;
//    }
//    catch (...) {
//        return BEAGLE_ERROR_UNIDENTIFIED_EXCEPTION;
//    }
}